

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int do_x509_check(X509 *x,char *chk,size_t chklen,uint flags,int check_type,char **peername)

{
  stack_st_GENERAL_NAME *sk;
  GENERAL_NAME *pGVar1;
  X509_NAME *name_00;
  X509_NAME_ENTRY *ne_00;
  ASN1_STRING *a;
  ASN1_STRING *str;
  X509_NAME_ENTRY *ne;
  X509_NAME *name;
  ASN1_STRING *pAStack_70;
  int j;
  ASN1_STRING *cstr;
  GENERAL_NAME *gen;
  size_t i;
  GENERAL_NAMES *gens;
  equal_fn equal;
  int local_40;
  int rv;
  int alt_type;
  int cnid;
  char **peername_local;
  int check_type_local;
  uint flags_local;
  size_t chklen_local;
  char *chk_local;
  X509 *x_local;
  
  rv = 0;
  equal._4_4_ = 0;
  if (check_type == 1) {
    rv = 0x30;
    local_40 = 0x16;
    gens = (GENERAL_NAMES *)equal_email;
  }
  else if (check_type == 2) {
    rv = 0xd;
    local_40 = 0x16;
    if ((flags & 2) == 0) {
      gens = (GENERAL_NAMES *)equal_wildcard;
    }
    else {
      gens = (GENERAL_NAMES *)equal_nocase;
    }
  }
  else {
    local_40 = 4;
    gens = (GENERAL_NAMES *)equal_case;
  }
  sk = (stack_st_GENERAL_NAME *)X509_get_ext_d2i((X509 *)x,0x55,(int *)0x0,(int *)0x0);
  if (sk == (stack_st_GENERAL_NAME *)0x0) {
    if ((rv == 0) || ((flags & 0x20) != 0)) {
      x_local._4_4_ = 0;
    }
    else {
      name._4_4_ = -1;
      name_00 = X509_get_subject_name((X509 *)x);
      do {
        name._4_4_ = X509_NAME_get_index_by_NID(name_00,rv,name._4_4_);
        if (name._4_4_ < 0) {
          return 0;
        }
        ne_00 = X509_NAME_get_entry(name_00,name._4_4_);
        a = X509_NAME_ENTRY_get_data(ne_00);
        x_local._4_4_ =
             do_check_string((ASN1_STRING *)a,-1,(equal_fn)gens,flags,check_type,chk,chklen,peername
                            );
      } while (x_local._4_4_ == 0);
    }
  }
  else {
    for (gen = (GENERAL_NAME *)0x0; pGVar1 = (GENERAL_NAME *)sk_GENERAL_NAME_num(sk), gen < pGVar1;
        gen = (GENERAL_NAME *)((long)&gen->type + 1)) {
      pGVar1 = sk_GENERAL_NAME_value(sk,(size_t)gen);
      if (pGVar1->type == check_type) {
        if (check_type == 1) {
          pAStack_70 = (pGVar1->d).x400Address;
        }
        else if (check_type == 2) {
          pAStack_70 = (pGVar1->d).x400Address;
        }
        else {
          pAStack_70 = (pGVar1->d).x400Address;
        }
        equal._4_4_ = do_check_string(pAStack_70,local_40,(equal_fn)gens,flags,check_type,chk,chklen
                                      ,peername);
        if (equal._4_4_ != 0) break;
      }
    }
    GENERAL_NAMES_free((GENERAL_NAMES *)sk);
    x_local._4_4_ = equal._4_4_;
  }
  return x_local._4_4_;
}

Assistant:

static int do_x509_check(const X509 *x, const char *chk, size_t chklen,
                         unsigned int flags, int check_type, char **peername) {
  int cnid = NID_undef;
  int alt_type;
  int rv = 0;
  equal_fn equal;
  if (check_type == GEN_EMAIL) {
    cnid = NID_pkcs9_emailAddress;
    alt_type = V_ASN1_IA5STRING;
    equal = equal_email;
  } else if (check_type == GEN_DNS) {
    cnid = NID_commonName;
    alt_type = V_ASN1_IA5STRING;
    if (flags & X509_CHECK_FLAG_NO_WILDCARDS) {
      equal = equal_nocase;
    } else {
      equal = equal_wildcard;
    }
  } else {
    alt_type = V_ASN1_OCTET_STRING;
    equal = equal_case;
  }

  GENERAL_NAMES *gens = reinterpret_cast<GENERAL_NAMES *>(
      X509_get_ext_d2i(x, NID_subject_alt_name, NULL, NULL));
  if (gens) {
    for (size_t i = 0; i < sk_GENERAL_NAME_num(gens); i++) {
      const GENERAL_NAME *gen = sk_GENERAL_NAME_value(gens, i);
      if (gen->type != check_type) {
        continue;
      }
      const ASN1_STRING *cstr;
      if (check_type == GEN_EMAIL) {
        cstr = gen->d.rfc822Name;
      } else if (check_type == GEN_DNS) {
        cstr = gen->d.dNSName;
      } else {
        cstr = gen->d.iPAddress;
      }
      // Positive on success, negative on error!
      if ((rv = do_check_string(cstr, alt_type, equal, flags, check_type, chk,
                                chklen, peername)) != 0) {
        break;
      }
    }
    GENERAL_NAMES_free(gens);
    return rv;
  }

  // We're done if CN-ID is not pertinent
  if (cnid == NID_undef || (flags & X509_CHECK_FLAG_NEVER_CHECK_SUBJECT)) {
    return 0;
  }

  int j = -1;
  const X509_NAME *name = X509_get_subject_name(x);
  while ((j = X509_NAME_get_index_by_NID(name, cnid, j)) >= 0) {
    const X509_NAME_ENTRY *ne = X509_NAME_get_entry(name, j);
    const ASN1_STRING *str = X509_NAME_ENTRY_get_data(ne);
    // Positive on success, negative on error!
    if ((rv = do_check_string(str, -1, equal, flags, check_type, chk, chklen,
                              peername)) != 0) {
      return rv;
    }
  }
  return 0;
}